

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::operator==(SilentEntitySystem *this,SilentEntitySystem *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  if (this->m_ui16NumEnts != Value->m_ui16NumEnts) {
    return false;
  }
  if ((this->m_ui16NumOfAppearanceRecords == Value->m_ui16NumOfAppearanceRecords) &&
     (KVar1 = EntityType::operator!=(&this->m_EntTyp,&Value->m_EntTyp), !KVar1)) {
    bVar2 = std::operator!=(&this->m_vEA,&Value->m_vEA);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL SilentEntitySystem::operator == ( const SilentEntitySystem & Value ) const
{
    if( m_ui16NumEnts                 != Value.m_ui16NumEnts )                return false;
    if( m_ui16NumOfAppearanceRecords  != Value.m_ui16NumOfAppearanceRecords ) return false;
    if( m_EntTyp                      != Value.m_EntTyp )                     return false;
    if( m_vEA                         != Value.m_vEA )                        return false;
    return true;
}